

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O1

void __thiscall
trng::discrete_dist::param_type::
param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
          (param_type *this,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  allocator_type local_29;
  void *local_28 [3];
  
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)local_28,first,last,&local_29);
  param_type(this,(vector<double,_std::allocator<double>_> *)local_28);
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0]);
  }
  return;
}

Assistant:

explicit param_type(iter first, iter last)
          : param_type{std::vector<double>(first, last)} {}